

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_ptr.hpp
# Opt level: O0

exception_ptr
boost::exception_detail::get_static_exception_object<boost::exception_detail::bad_exception_>(void)

{
  int iVar1;
  type pcVar2;
  bad_exception_ *this;
  shared_count extraout_RDX;
  clone_impl<boost::exception_detail::bad_exception_> *in_RDI;
  exception_ptr eVar3;
  clone_impl<boost::exception_detail::bad_exception_> c;
  bad_exception_ ba;
  impl *in_stack_ffffffffffffff28;
  bad_exception_ *in_stack_ffffffffffffff30;
  bad_exception_ *in_stack_ffffffffffffff38;
  clone_impl<boost::exception_detail::bad_exception_> *this_00;
  clone_impl<boost::exception_detail::bad_exception_> *in_stack_ffffffffffffff58;
  shared_ptr<const_boost::exception_detail::clone_base> *in_stack_ffffffffffffff60;
  error_info<boost::throw_line_,_int> local_94;
  error_info<boost::throw_file_,_const_char_*> local_90;
  error_info<boost::throw_function_,_const_char_*> local_88 [17];
  
  this_00 = in_RDI;
  bad_exception_::bad_exception_(in_stack_ffffffffffffff30);
  clone_impl<boost::exception_detail::bad_exception_>::clone_impl(this_00,in_stack_ffffffffffffff38)
  ;
  error_info<boost::throw_function_,_const_char_*>::error_info
            (local_88,
             "exception_ptr boost::exception_detail::get_static_exception_object() [Exception = boost::exception_detail::bad_exception_]"
            );
  pcVar2 = operator<<((clone_impl<boost::exception_detail::bad_exception_> *)
                      in_stack_ffffffffffffff30,
                      (error_info<boost::throw_function_,_const_char_*> *)in_stack_ffffffffffffff28)
  ;
  error_info<boost::throw_file_,_const_char_*>::error_info
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/exception/detail/exception_ptr.hpp"
            );
  this = &operator<<((clone_impl<boost::exception_detail::bad_exception_> *)
                     in_stack_ffffffffffffff30,
                     (error_info<boost::throw_file_,_const_char_*> *)in_stack_ffffffffffffff28)->
          super_bad_exception_;
  error_info<boost::throw_line_,_int>::error_info(&local_94,0x81);
  operator<<((clone_impl<boost::exception_detail::bad_exception_> *)this,
             (error_info<boost::throw_line_,_int> *)in_stack_ffffffffffffff28);
  if (get_static_exception_object<boost::exception_detail::bad_exception_>()::ep == '\0') {
    iVar1 = __cxa_guard_acquire(&get_static_exception_object<boost::exception_detail::bad_exception_>()
                                 ::ep);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff28 = (impl *)operator_new(0x38);
      clone_impl<boost::exception_detail::bad_exception_>::clone_impl(this_00,pcVar2);
      shared_ptr<boost::exception_detail::clone_base_const>::
      shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      exception_ptr::exception_ptr((exception_ptr *)this,in_stack_ffffffffffffff28);
      shared_ptr<const_boost::exception_detail::clone_base>::~shared_ptr
                ((shared_ptr<const_boost::exception_detail::clone_base> *)0x12eb2e);
      __cxa_atexit(exception_ptr::~exception_ptr,
                   &get_static_exception_object<boost::exception_detail::bad_exception_>::ep,
                   &__dso_handle);
      __cxa_guard_release(&get_static_exception_object<boost::exception_detail::bad_exception_>()::
                           ep);
    }
  }
  exception_ptr::exception_ptr((exception_ptr *)this,(exception_ptr *)in_stack_ffffffffffffff28);
  clone_impl<boost::exception_detail::bad_exception_>::~clone_impl
            ((clone_impl<boost::exception_detail::bad_exception_> *)this);
  bad_exception_::~bad_exception_(this);
  eVar3.ptr_.pn.pi_ = extraout_RDX.pi_;
  eVar3.ptr_.px = (element_type *)in_RDI;
  return (exception_ptr)eVar3.ptr_;
}

Assistant:

exception_ptr
        get_static_exception_object()
            {
            Exception ba;
            exception_detail::clone_impl<Exception> c(ba);
#ifndef BOOST_EXCEPTION_DISABLE
            c <<
                throw_function(BOOST_CURRENT_FUNCTION) <<
                throw_file(__FILE__) <<
                throw_line(__LINE__);
#endif
            static exception_ptr ep(shared_ptr<exception_detail::clone_base const>(new exception_detail::clone_impl<Exception>(c)));
            return ep;
            }